

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_combo_begin_symbol(nk_context *ctx,nk_symbol_type symbol,nk_vec2 size)

{
  float fVar1;
  float fVar2;
  float fVar3;
  nk_window *win;
  nk_rect r;
  nk_rect rect;
  nk_rect header_00;
  nk_rect content_00;
  undefined8 uVar4;
  undefined8 uVar5;
  nk_widget_layout_states nVar6;
  int iVar7;
  nk_color *pnVar8;
  long lVar9;
  nk_color c;
  nk_context *i;
  nk_style_combo *pnVar10;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar11;
  nk_rect r_00;
  nk_rect rect_00;
  nk_rect header;
  nk_rect bounds;
  nk_rect content;
  nk_rect local_a0;
  nk_symbol_type local_90;
  nk_symbol_type local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  nk_rect local_58;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x5323,
                  "int nk_combo_begin_symbol(struct nk_context *, enum nk_symbol_type, struct nk_vec2)"
                 );
  }
  win = ctx->current;
  if (win != (nk_window *)0x0) {
    local_68._8_4_ = in_XMM0_Dc;
    local_68._0_8_ = size;
    local_68._12_4_ = in_XMM0_Dd;
    if (win->layout != (nk_panel *)0x0) {
      nVar6 = nk_widget(&local_a0,ctx);
      if (nVar6 == NK_WIDGET_INVALID) {
        iVar7 = 0;
      }
      else {
        i = ctx;
        if ((win->layout->flags & 0x800) != 0) {
          i = (nk_context *)0x0;
        }
        if (nVar6 == NK_WIDGET_ROM) {
          i = (nk_context *)0x0;
        }
        local_88 = CONCAT44(local_a0.y,local_a0.x);
        local_78 = CONCAT44(local_a0.h,local_a0.w);
        r.y = local_a0.y;
        r.x = local_a0.x;
        r.w = local_a0.w;
        r.h = local_a0.h;
        uStack_80 = 0;
        uStack_70 = 0;
        iVar7 = nk_button_behavior(&ctx->last_widget_state,r,&i->input,NK_BUTTON_DEFAULT);
        uVar5 = local_78;
        uVar4 = local_88;
        if ((ctx->last_widget_state & 0x20) == 0) {
          pnVar8 = &(ctx->style).combo.symbol_hover;
          if ((ctx->last_widget_state & 0x10) == 0) {
            pnVar10 = &(ctx->style).combo;
          }
          else {
            pnVar10 = (nk_style_combo *)&(ctx->style).combo.hover;
          }
        }
        else {
          pnVar10 = (nk_style_combo *)&(ctx->style).combo.active;
          pnVar8 = &(ctx->style).combo.symbol_active;
        }
        local_78 = CONCAT44(local_78._4_4_,(uint)(iVar7 != 0));
        local_88 = CONCAT44(local_88._4_4_,*pnVar8);
        local_8c = symbol;
        if ((pnVar10->normal).type == NK_STYLE_ITEM_IMAGE) {
          local_78._0_4_ = (int)uVar5;
          local_78._4_4_ = SUB84(uVar5,4);
          r_00.w = (float)(int)local_78;
          r_00.h = (float)local_78._4_4_;
          local_88._0_4_ = SUB84(uVar4,0);
          local_88._4_4_ = SUB84(uVar4,4);
          r_00.x = (float)local_88._0_4_;
          r_00.y = (float)local_88._4_4_;
          nk_draw_image(&win->buffer,r_00,&(pnVar10->normal).data.image,(nk_color)0xffffffff);
          c.r = '\0';
          c.g = '\0';
          c.b = '\0';
          c.a = '\0';
        }
        else {
          c = (pnVar10->normal).data.color;
          local_78._0_4_ = (int)uVar5;
          local_78._4_4_ = SUB84(uVar5,4);
          rect_00.w = (float)(int)local_78;
          rect_00.h = (float)local_78._4_4_;
          local_88._0_4_ = SUB84(uVar4,0);
          local_88._4_4_ = SUB84(uVar4,4);
          rect_00.x = (float)local_88._0_4_;
          rect_00.y = (float)local_88._4_4_;
          nk_fill_rect(&win->buffer,rect_00,(ctx->style).combo.rounding,c);
          rect.y = local_a0.y;
          rect.x = local_a0.x;
          rect.w = local_a0.w;
          rect.h = local_a0.h;
          nk_stroke_rect(&win->buffer,rect,(ctx->style).combo.rounding,(ctx->style).combo.border,
                         (ctx->style).combo.border_color);
        }
        lVar9 = 0x1bd4;
        if ((ctx->last_widget_state & 0x10) == 0) {
          lVar9 = (ulong)(iVar7 != 0) * 8 + 0x1bd0;
        }
        local_90 = *(nk_symbol_type *)((long)&(ctx->input).keyboard.keys[0].down + lVar9);
        fVar1 = (ctx->style).combo.button.padding.x;
        fVar2 = (ctx->style).combo.button_padding.y;
        local_40.h = local_a0.h - (fVar2 + fVar2);
        fVar11 = ((local_a0.w + local_a0.x) - local_a0.h) - fVar2;
        local_40.x = fVar1 + fVar11;
        fVar3 = (ctx->style).combo.button.padding.y;
        local_40.y = fVar2 + local_a0.y + fVar3;
        local_40.w = local_40.h - (fVar1 + fVar1);
        local_40.h = local_40.h - (fVar3 + fVar3);
        fVar1 = (ctx->style).combo.content_padding.y;
        local_58.y = local_a0.y + fVar1;
        local_58.h = local_a0.h - (fVar1 + fVar1);
        local_58.x = local_a0.x + (ctx->style).combo.content_padding.x;
        local_58.w = (fVar11 - fVar1) - local_58.x;
        content_00.y = local_58.y;
        content_00.x = local_58.x;
        content_00.w = local_58.w;
        content_00.h = local_58.h;
        nk_draw_symbol(&win->buffer,local_8c,content_00,c,local_88._0_4_,1.0,(ctx->style).font);
        nk_draw_button_symbol
                  (&win->buffer,&local_58,&local_40,ctx->last_widget_state,
                   &(ctx->style).combo.button,local_90,(ctx->style).font);
        header_00.y = local_a0.y;
        header_00.x = local_a0.x;
        header_00.w = local_a0.w;
        header_00.h = local_a0.h;
        iVar7 = nk_combo_begin(ctx,win,(nk_vec2)local_68._0_8_,(int)local_78,header_00);
      }
      return iVar7;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x5325,
                  "int nk_combo_begin_symbol(struct nk_context *, enum nk_symbol_type, struct nk_vec2)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x5324,
                "int nk_combo_begin_symbol(struct nk_context *, enum nk_symbol_type, struct nk_vec2)"
               );
}

Assistant:

NK_API int
nk_combo_begin_symbol(struct nk_context *ctx, enum nk_symbol_type symbol, struct nk_vec2 size)
{
    struct nk_window *win;
    struct nk_style *style;
    const struct nk_input *in;

    struct nk_rect header;
    int is_clicked = nk_false;
    enum nk_widget_layout_states s;
    const struct nk_style_item *background;
    struct nk_color sym_background;
    struct nk_color symbol_color;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    s = nk_widget(&header, ctx);
    if (s == NK_WIDGET_INVALID)
        return 0;

    in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
    if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
        is_clicked = nk_true;

    /* draw combo box header background and border */
    if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
        background = &style->combo.active;
        symbol_color = style->combo.symbol_active;
    } else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
        background = &style->combo.hover;
        symbol_color = style->combo.symbol_hover;
    } else {
        background = &style->combo.normal;
        symbol_color = style->combo.symbol_hover;
    }

    if (background->type == NK_STYLE_ITEM_IMAGE) {
        sym_background = nk_rgba(0,0,0,0);
        nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
    } else {
        sym_background = background->data.color;
        nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
        nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
    }
    {
        struct nk_rect bounds = {0,0,0,0};
        struct nk_rect content;
        struct nk_rect button;

        enum nk_symbol_type sym;
        if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
            sym = style->combo.sym_hover;
        else if (is_clicked)
            sym = style->combo.sym_active;
        else sym = style->combo.sym_normal;

        /* calculate button */
        button.w = header.h - 2 * style->combo.button_padding.y;
        button.x = (header.x + header.w - header.h) - style->combo.button_padding.y;
        button.y = header.y + style->combo.button_padding.y;
        button.h = button.w;

        content.x = button.x + style->combo.button.padding.x;
        content.y = button.y + style->combo.button.padding.y;
        content.w = button.w - 2 * style->combo.button.padding.x;
        content.h = button.h - 2 * style->combo.button.padding.y;

        /* draw symbol */
        bounds.h = header.h - 2 * style->combo.content_padding.y;
        bounds.y = header.y + style->combo.content_padding.y;
        bounds.x = header.x + style->combo.content_padding.x;
        bounds.w = (button.x - style->combo.content_padding.y) - bounds.x;
        nk_draw_symbol(&win->buffer, symbol, bounds, sym_background, symbol_color,
            1.0f, style->font);

        /* draw open/close button */
        nk_draw_button_symbol(&win->buffer, &bounds, &content, ctx->last_widget_state,
            &ctx->style.combo.button, sym, style->font);
    }
    return nk_combo_begin(ctx, win, size, is_clicked, header);
}